

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_def.c
# Opt level: O3

_Bool upb_FileDef_Resolves(upb_FileDef *f,char *path)

{
  _Bool _Var1;
  int iVar2;
  upb_FileDef *f_00;
  
  iVar2 = strcmp(f->name,path);
  if (iVar2 == 0) {
    _Var1 = true;
  }
  else {
    iVar2 = 0;
    if (f->public_dep_count < 1) {
      _Var1 = false;
    }
    else {
      do {
        f_00 = upb_FileDef_PublicDependency(f,iVar2);
        _Var1 = upb_FileDef_Resolves(f_00,path);
        if (_Var1) {
          return _Var1;
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < f->public_dep_count);
    }
  }
  return _Var1;
}

Assistant:

bool upb_FileDef_Resolves(const upb_FileDef* f, const char* path) {
  if (!strcmp(f->name, path)) return true;

  for (int i = 0; i < upb_FileDef_PublicDependencyCount(f); i++) {
    const upb_FileDef* dep = upb_FileDef_PublicDependency(f, i);
    if (upb_FileDef_Resolves(dep, path)) return true;
  }
  return false;
}